

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_vine_swap.h
# Opt level: O1

bool __thiscall
Gudhi::persistence_matrix::
RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_positive_negative_vine_swap
          (RU_vine_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
           *this,Index columnIndex)

{
  ulong uVar1;
  size_t sVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  _Hash_node_base *p_Var5;
  uint uVar6;
  __hash_code __code;
  ulong uVar7;
  pointer pEVar8;
  pointer p;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  
  uVar6 = columnIndex + 1;
  uVar1 = (this->super_type).super_type.map_._M_h._M_bucket_count;
  uVar7 = (ulong)uVar6 % uVar1;
  p_Var9 = (this->super_type).super_type.map_._M_h._M_buckets[uVar7];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var9->_M_nxt, p_Var10 = p_Var9, *(uint *)&p_Var9->_M_nxt[1]._M_nxt != uVar6)) {
    while (p_Var9 = p_Var5, p_Var5 = p_Var9->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var10 = p_Var9, *(uint *)&p_Var5[1]._M_nxt == uVar6)) goto LAB_00162436;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00162436:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var10->_M_nxt;
  }
  if (p_Var5 != (_Hash_node_base *)0x0) {
    uVar6 = *(uint *)((long)&p_Var5[1]._M_nxt + 4);
  }
  sVar2 = this[2].super_type.super_type.map_._M_h._M_rehash_policy._M_next_resize;
  pEVar8 = (pointer)(sVar2 + (ulong)columnIndex * 0x28 + 0x18);
  p = pEVar8;
  do {
    p = (pointer)(p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p == pEVar8) goto LAB_001624a1;
    if (p == (pointer)0x0) {
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (p->rowIndex_ !=
           *(ID_index *)
            (this[1].super_type.idToPosition_._M_h._M_rehash_policy._M_next_resize +
            (ulong)uVar6 * 4));
  plVar3 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar4 = (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar4->next_ = plVar3;
  plVar3->prev_ = plVar4;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>
  ::destroy(*(Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>
              **)(sVar2 + (ulong)columnIndex * 0x28 + 0x10),p);
LAB_001624a1:
  _swap_at_index(this,columnIndex);
  _positive_negative_transpose(this,columnIndex);
  return true;
}

Assistant:

inline bool RU_vine_swap<Master_matrix>::_positive_negative_vine_swap(Index columnIndex) 
{
  _matrix()->mirrorMatrixU_.zero_entry(columnIndex, _get_row_id_from_position(columnIndex + 1));

  _swap_at_index(columnIndex);
  _positive_negative_transpose(columnIndex);

  return true;
}